

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player_delay.h
# Opt level: O1

void __thiscall PlayerDelay::~PlayerDelay(PlayerDelay *this)

{
  pointer pcVar1;
  
  (this->super_Player)._vptr_Player = (_func_int **)&PTR__Player_0010c820;
  pcVar1 = (this->super_Player).m_name._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->super_Player).m_name.field_2) {
    operator_delete(pcVar1);
  }
  operator_delete(this);
  return;
}

Assistant:

PlayerDelay(const std::string& name) :
      Player(name)
   {}